

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O2

string * QUtil::mac_roman_to_utf8(string *__return_storage_ptr__,string *val)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = val->_M_string_length;
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    auVar4 = std::__cxx11::string::at((ulong)val);
    uVar2 = (uint)*auVar4._0_8_;
    if (*auVar4._0_8_ < '\0') {
      uVar2 = (uint)mac_roman_to_unicode[uVar2 & 0x7f];
    }
    toUTF8_abi_cxx11_(&local_50,(QUtil *)(ulong)(uVar2 & 0xffff),auVar4._8_8_);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::mac_roman_to_utf8(std::string const& val)
{
    std::string result;
    size_t len = val.length();
    for (unsigned int i = 0; i < len; ++i) {
        unsigned char ch = static_cast<unsigned char>(val.at(i));
        unsigned short ch_short = ch;
        if (ch >= 128) {
            ch_short = mac_roman_to_unicode[ch - 128];
        }
        result += QUtil::toUTF8(ch_short);
    }
    return result;
}